

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.hh
# Opt level: O3

size_t __thiscall
tchecker::
periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
::collect(periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
          *this)

{
  size_t sVar1;
  size_t sVar2;
  
  if (this->_count < this->_period) {
    sVar2 = this->_count + 1;
  }
  else {
    sVar1 = cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
            ::collect(&this->
                       super_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
                     );
    if (sVar1 != 0) {
      this->_period = 1;
      sVar2 = 1;
      goto LAB_00173f2f;
    }
    sVar2 = 1;
    if (this->_period < 0x7fffffffffffffff) {
      this->_period = this->_period * 2;
    }
  }
  sVar1 = 0;
LAB_00173f2f:
  this->_count = sVar2;
  return sVar1;
}

Assistant:

virtual std::size_t collect()
  {
    if (_count >= _period) {
      std::size_t n = tchecker::cache_t<SPTR, HASH, EQUAL>::collect();
      if (n > 0)
        _period = 1;
      else if (_period < std::numeric_limits<std::size_t>::max() / 2)
        _period *= 2;
      _count = 1;
      return n;
    }

    ++_count;
    return 0;
  }